

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::init
          (TextureBorderClampPerAxisCase3D *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *this_00;
  IVec3 *pIVar1;
  deUint32 format;
  Context *pCVar2;
  RenderContext *renderCtx;
  ContextInfo *contextInfo;
  pointer pfVar3;
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> data;
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> data_00;
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> data_01;
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> data_02;
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> data_03;
  PtrData<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  data_04;
  bool bVar4;
  bool bVar5;
  ContextType CVar6;
  GLSLVersion glslVersion;
  CompressedTexFormat format_00;
  float format_01;
  RenderTarget *pRVar7;
  Texture3D *pTVar8;
  TextureRenderer *this_01;
  char *pcVar9;
  NotSupportedError *pNVar10;
  GenericVec4 GVar11;
  int in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8c [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  PixelBufferAccess stencilAccess;
  CompressedTexFormat compressedFormat;
  float fStack_21c;
  int local_1f8 [2];
  TexDecompressionParams decompressionParams;
  PixelBufferAccess depthAccess;
  float afStack_1a8 [2];
  float local_1a0 [2];
  float afStack_198 [82];
  string local_50;
  
  CVar6.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar6,(ApiType)0x23);
  CVar6.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(CVar6);
  if (!bVar4) {
    bVar5 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_border_clamp");
    if (!bVar5) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&depthAccess,"Test requires GL_EXT_texture_border_clamp extension",
                 (allocator<char> *)&stencilAccess);
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)&depthAccess);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  bVar5 = glu::isCompressedFormat(this->m_texFormat);
  if (!bVar4 && bVar5) {
    format_00 = glu::mapGLCompressedTexFormat(this->m_texFormat);
    bVar4 = tcu::isAstcFormat(format_00);
    if (bVar4) {
      bVar4 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_KHR_texture_compression_astc_ldr");
      if (!bVar4) {
        pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&depthAccess,
                   "Test requires GL_KHR_texture_compression_astc_ldr extension",
                   (allocator<char> *)&stencilAccess);
        tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)&depthAccess);
        __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  if (this->m_texFormat == 0x80e1) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_format_BGRA8888");
    if (!bVar4) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&depthAccess,"Test requires GL_EXT_texture_format_BGRA8888 extension",
                 (allocator<char> *)&stencilAccess);
      tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)&depthAccess);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar7->m_width < 0x80) {
LAB_012aa503:
    pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1f8[1] = 0x80;
    de::toString<int>((string *)&decompressionParams,local_1f8 + 1);
    std::operator+(&local_268,"Test requires ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &decompressionParams);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compressedFormat,&local_268,"x");
    local_1f8[0] = 0x80;
    de::toString<int>(&local_50,local_1f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stencilAccess,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compressedFormat,&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&depthAccess
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stencilAccess," viewport");
    tcu::NotSupportedError::NotSupportedError(pNVar10,(string *)&depthAccess);
    __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar7->m_height < 0x80) goto LAB_012aa503;
  pCVar2 = (this->super_TestCase).m_context;
  renderCtx = pCVar2->m_renderCtx;
  contextInfo = pCVar2->m_contextInfo;
  format = this->m_texFormat;
  local_268._M_dataplus._M_p = (pointer)0x0;
  bVar4 = isDepthFormat(format,MODE_DEPTH);
  if (bVar4) {
LAB_012a9fdc:
    TextureTraits<glu::Texture3D>::createTextureFromInternalFormat
              ((MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&depthAccess,
               renderCtx,format,&this->m_size);
    depthAccess.super_ConstPixelBufferAccess.m_format.order = R;
    depthAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
    data._4_12_ = in_stack_fffffffffffffd8c;
    data.ptr._0_4_ = in_stack_fffffffffffffd88;
    de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::assignData
              ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_268,data);
    de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::~UniqueBase
              ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&depthAccess);
    tcu::Texture3D::allocLevel((Texture3D *)(local_268._M_dataplus._M_p + 0x10),0);
    bVar4 = isDepthFormat(format,MODE_DEPTH);
    if (bVar4) {
      tcu::getEffectiveDepthStencilAccess
                (&depthAccess,
                 (((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                  (local_268._M_dataplus._M_p + 0x30))->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start,MODE_DEPTH);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stencilAccess,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&compressedFormat,1.0);
      tcu::fillWithComponentGradients
                (&depthAccess,(Vec4 *)&stencilAccess,(Vector<float,_4> *)&compressedFormat);
    }
    bVar4 = isStencilFormat(format,MODE_STENCIL);
    if (bVar4) {
      tcu::getEffectiveDepthStencilAccess
                (&stencilAccess,
                 (((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                  (local_268._M_dataplus._M_p + 0x30))->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start,MODE_STENCIL);
      tcu::getTextureFormatInfo((TextureFormatInfo *)&depthAccess,(TextureFormat *)&stencilAccess);
      tcu::flipYAccess((PixelBufferAccess *)&compressedFormat,&stencilAccess);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)&compressedFormat,
                 (Vec4 *)(depthAccess.super_ConstPixelBufferAccess.m_size.m_data + 2),
                 (Vec4 *)&depthAccess);
    }
  }
  else {
    bVar4 = isStencilFormat(format,MODE_STENCIL);
    if (bVar4) goto LAB_012a9fdc;
    bVar4 = glu::isCompressedFormat(format);
    if (bVar4) {
      format_01 = (float)glu::mapGLCompressedTexFormat(format);
      compressedFormat = (CompressedTexFormat)format_01;
      tcu::CompressedTexture::CompressedTexture
                ((CompressedTexture *)&depthAccess,(CompressedTexFormat)format_01,
                 (this->m_size).m_data[0],(this->m_size).m_data[1],(this->m_size).m_data[2]);
      bVar4 = tcu::isAstcFormat((CompressedTexFormat)format_01);
      decompressionParams.astcMode = (uint)!bVar4 * 2;
      generateDummyCompressedData((CompressedTexture *)&depthAccess,&compressedFormat);
      pTVar8 = (Texture3D *)operator_new(0x70);
      glu::Texture3D::Texture3D
                (pTVar8,renderCtx,contextInfo,1,(CompressedTexture *)&depthAccess,
                 &decompressionParams);
      stencilAccess.super_ConstPixelBufferAccess.m_format.order = R;
      stencilAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      data_00._4_12_ = in_stack_fffffffffffffd8c;
      data_00.ptr._0_4_ = in_stack_fffffffffffffd88;
      de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::assignData
                ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_268,
                 data_00);
      de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::~UniqueBase
                ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&stencilAccess);
      tcu::CompressedTexture::~CompressedTexture((CompressedTexture *)&depthAccess);
      goto LAB_012aa2cb;
    }
    if (((format - 0x1906 < 5) && ((0x19U >> (format - 0x1906 & 0x1f) & 1) != 0)) ||
       (format == 0x80e1)) {
      pTVar8 = (Texture3D *)operator_new(0x70);
      in_stack_fffffffffffffd88 = (this->m_size).m_data[2];
      glu::Texture3D::Texture3D
                (pTVar8,renderCtx,format,0x1401,(this->m_size).m_data[0],(this->m_size).m_data[1],
                 in_stack_fffffffffffffd88);
      depthAccess.super_ConstPixelBufferAccess.m_format.order = R;
      depthAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      data_01._4_12_ = in_stack_fffffffffffffd8c;
      data_01.ptr._0_4_ = in_stack_fffffffffffffd88;
      de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::assignData
                ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_268,
                 data_01);
    }
    else {
      TextureTraits<glu::Texture3D>::createTextureFromInternalFormat
                ((MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&depthAccess,
                 renderCtx,format,&this->m_size);
      depthAccess.super_ConstPixelBufferAccess.m_format.order = R;
      depthAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      data_02._4_12_ = in_stack_fffffffffffffd8c;
      data_02.ptr._0_4_ = in_stack_fffffffffffffd88;
      de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::assignData
                ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_268,
                 data_02);
    }
    de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::~UniqueBase
              ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&depthAccess);
    tcu::Texture3D::allocLevel((Texture3D *)(local_268._M_dataplus._M_p + 0x10),0);
    tcu::getTextureFormatInfo
              ((TextureFormatInfo *)&depthAccess,
               (TextureFormat *)(local_268._M_dataplus._M_p + 0x10));
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&stencilAccess,(Vector<float,_4> *)&depthAccess);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&compressedFormat,
               (Vector<float,_4> *)(depthAccess.super_ConstPixelBufferAccess.m_size.m_data + 2));
    tcu::fillWithComponentGradients
              ((((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                (local_268._M_dataplus._M_p + 0x30))->
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&stencilAccess,
               (Vector<float,_4> *)&compressedFormat);
  }
  glu::Texture3D::upload((Texture3D *)local_268._M_dataplus._M_p);
LAB_012aa2cb:
  local_268._M_dataplus._M_p = (pointer)0x0;
  this_00 = &this->m_texture;
  data_03._4_12_ = in_stack_fffffffffffffd8c;
  data_03.ptr._0_4_ = in_stack_fffffffffffffd88;
  de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::assignData
            (&this_00->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>,data_03
            );
  de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::~UniqueBase
            ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_268);
  this_01 = (TextureRenderer *)operator_new(0x58);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (this_01,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,glslVersion,
             PRECISION_HIGHP);
  depthAccess.super_ConstPixelBufferAccess.m_format.order = R;
  depthAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  data_04._4_12_ = in_stack_fffffffffffffd8c;
  data_04.ptr._0_4_ = in_stack_fffffffffffffd88;
  de::details::
  UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  ::assignData(&(this->m_renderer).
                super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
               ,data_04);
  de::details::
  UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  ::~UniqueBase((UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
                 *)&depthAccess);
  depthAccess.super_ConstPixelBufferAccess.m_format =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pIVar1 = &depthAccess.super_ConstPixelBufferAccess.m_size;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,"Created 3D texture with format ");
  pcVar9 = glu::getTextureFormatName(this->m_texFormat);
  std::operator<<((ostream *)pIVar1,pcVar9);
  std::operator<<((ostream *)pIVar1,", size (");
  std::ostream::operator<<
            (pIVar1,(((this_00->
                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.
                     ptr)->m_refTexture).m_width);
  std::operator<<((ostream *)pIVar1,", ");
  std::ostream::operator<<
            (pIVar1,(((this_00->
                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.
                     ptr)->m_refTexture).m_height);
  std::operator<<((ostream *)pIVar1,", ");
  std::ostream::operator<<
            (pIVar1,(((this_00->
                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.
                     ptr)->m_refTexture).m_depth);
  std::operator<<((ostream *)pIVar1,")\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&depthAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  depthAccess.super_ConstPixelBufferAccess.m_format =
       (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pIVar1 = &depthAccess.super_ConstPixelBufferAccess.m_size;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
  std::operator<<((ostream *)pIVar1,
                  "Setting tex coords bottom-left: (-1, -1, -1.5), top-right (2, 2, 2.5)\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&depthAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
  std::vector<float,_std::allocator<float>_>::resize(&this->m_texCoords,0xc);
  pfVar3 = (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3[0] = -1.0;
  pfVar3[1] = -1.0;
  pfVar3[2] = -1.5;
  pfVar3[3] = -1.0;
  pfVar3[4] = 2.0;
  pfVar3[5] = 0.5;
  pfVar3[6] = 2.0;
  pfVar3[7] = -1.0;
  pfVar3[8] = 0.5;
  pfVar3[9] = 2.0;
  pfVar3[10] = 2.0;
  pfVar3[0xb] = 2.5;
  _compressedFormat =
       (((this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.
         m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo((TextureFormatInfo *)&depthAccess,(TextureFormat *)&compressedFormat);
  stencilAccess.super_ConstPixelBufferAccess.m_format.order = 0x3e4ccccd;
  stencilAccess.super_ConstPixelBufferAccess.m_format.type = 0x3f19999a;
  stencilAccess.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f666666;
  stencilAccess.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3ecccccd;
  GVar11 = mapToFormatColorRepresentable((TextureFormat *)&compressedFormat,(Vec4 *)&stencilAccess);
  (this->m_borderColor).v.uData[0] = GVar11.v._0_4_;
  (this->m_borderColor).v.uData[1] = GVar11.v._4_4_;
  (this->m_borderColor).v.uData[2] = GVar11.v._8_4_;
  (this->m_borderColor).v.uData[3] = GVar11.v._12_4_;
  *(void **)(this->m_lookupScale).m_data = depthAccess.super_ConstPixelBufferAccess.m_data;
  *(float (*) [2])((this->m_lookupScale).m_data + 2) = afStack_1a8;
  *(float (*) [2])(this->m_lookupBias).m_data = local_1a0;
  *(undefined8 *)((this->m_lookupBias).m_data + 2) = afStack_198._0_8_;
  return GVar11.v._4_4_;
}

Assistant:

void TextureBorderClampPerAxisCase3D::init (void)
{
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_border_clamp"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_border_clamp extension");

	if (glu::isCompressedFormat(m_texFormat)													&&
		!supportsES32																			&&
		tcu::isAstcFormat(glu::mapGLCompressedTexFormat(m_texFormat))							&&
		!m_context.getContextInfo().isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
	{
		throw tcu::NotSupportedError("Test requires GL_KHR_texture_compression_astc_ldr extension");
	}
	if (m_texFormat == GL_BGRA && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_format_BGRA8888"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_format_BGRA8888 extension");
	if (m_context.getRenderTarget().getWidth() < VIEWPORT_WIDTH ||
		m_context.getRenderTarget().getHeight() < VIEWPORT_HEIGHT)
	{
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(VIEWPORT_WIDTH) + "x" + de::toString<int>(VIEWPORT_HEIGHT) + " viewport");
	}

	// resources
	m_texture = genDummyTexture<glu::Texture3D>(m_context.getRenderContext(), m_context.getContextInfo(), m_texFormat, m_size);
	m_renderer = de::MovePtr<gls::TextureTestUtil::TextureRenderer>(new gls::TextureTestUtil::TextureRenderer(m_context.getRenderContext(), m_testCtx.getLog(), glslVersion, glu::PRECISION_HIGHP));

	// texture info
	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Created 3D texture with format " << glu::getTextureFormatName(m_texFormat)
						<< ", size (" << m_texture->getRefTexture().getWidth() << ", " << m_texture->getRefTexture().getHeight() << ", " << m_texture->getRefTexture().getDepth() << ")\n"
						<< tcu::TestLog::EndMessage;

	// tex coord
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Setting tex coords bottom-left: (-1, -1, -1.5), top-right (2, 2, 2.5)\n"
							<< tcu::TestLog::EndMessage;

		m_texCoords.resize(4*3);

		m_texCoords[0] = -1.0f; m_texCoords[ 1] = -1.0f; m_texCoords[ 2] = -1.5f;
		m_texCoords[3] = -1.0f; m_texCoords[ 4] =  2.0f; m_texCoords[ 5] = 0.5f;
		m_texCoords[6] =  2.0f; m_texCoords[ 7] = -1.0f; m_texCoords[ 8] = 0.5f;
		m_texCoords[9] =  2.0f; m_texCoords[10] =  2.0f; m_texCoords[11] =  2.5f;
	}

	// set render params
	{
		const tcu::TextureFormat		texFormat		= m_texture->getRefTexture().getFormat();
		const tcu::TextureFormatInfo	texFormatInfo	= tcu::getTextureFormatInfo(texFormat);

		m_borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.2f, 0.6f, 0.9f, 0.4f));

		m_lookupScale	= texFormatInfo.lookupScale;
		m_lookupBias	= texFormatInfo.lookupBias;
	}
}